

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O3

send_result_t
zmq::send_multipart<std::initializer_list<zmq::const_buffer>,void>
          (socket_ref s,initializer_list<zmq::const_buffer> *msgs,send_flags flags)

{
  undefined4 in_register_00000014;
  undefined8 uVar1;
  ulong extraout_RDX;
  iterator pcVar2;
  int in_R8D;
  long lVar3;
  _Storage<unsigned_long,_true> _Var4;
  send_result_t sVar5;
  socket_base local_38;
  
  uVar1 = CONCAT71((int7)(CONCAT44(in_register_00000014,flags) >> 8),1);
  if (msgs->_M_len == 0) {
    _Var4._M_value = 0;
  }
  else {
    pcVar2 = msgs->_M_array;
    lVar3 = msgs->_M_len << 4;
    _Var4._M_value = 0;
    local_38 = s.super_socket_base._handle;
    do {
      detail::socket_base::send
                (&local_38,(int)pcVar2->_data,(void *)pcVar2->_size,
                 (ulong)((uint)(lVar3 != 0x10) * 2 | flags),in_R8D);
      if ((extraout_RDX & 1) == 0) {
        if (pcVar2 != msgs->_M_array) {
          __assert_fail("it == begin(msgs)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp"
                        ,0xf1,
                        "send_result_t zmq::send_multipart(socket_ref, Range &&, send_flags) [Range = std::initializer_list<zmq::const_buffer>]"
                       );
        }
        uVar1 = 0;
        goto LAB_0014841e;
      }
      pcVar2 = pcVar2 + 1;
      _Var4._M_value = _Var4._M_value + 1;
      lVar3 = lVar3 + -0x10;
    } while (lVar3 != 0);
    uVar1 = CONCAT71((int7)(extraout_RDX >> 8),1);
  }
LAB_0014841e:
  sVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar1;
  sVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var4._M_value;
  return (send_result_t)
         sVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

send_result_t
send_multipart(socket_ref s, Range &&msgs, send_flags flags = send_flags::none)
{
    using std::begin;
    using std::end;
    auto it = begin(msgs);
    const auto end_it = end(msgs);
    size_t msg_count = 0;
    while (it != end_it) {
        const auto next = std::next(it);
        const auto msg_flags =
          flags | (next == end_it ? send_flags::none : send_flags::sndmore);
        if (!s.send(*it, msg_flags)) {
            // zmq ensures atomic delivery of messages
            assert(it == begin(msgs));
            return {};
        }
        ++msg_count;
        it = next;
    }
    return msg_count;
}